

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_impulse_response_digital_filter.cc
# Opt level: O3

bool __thiscall
sptk::InfiniteImpulseResponseDigitalFilter::Run
          (InfiniteImpulseResponseDigitalFilter *this,double input,double *output,Buffer *buffer)

{
  pointer pdVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  pointer __s;
  double dVar10;
  
  bVar6 = (bool)(buffer != (Buffer *)0x0 & output != (double *)0x0 & this->is_valid_);
  if (bVar6 == true) {
    __s = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    uVar4 = (ulong)this->num_filter_order_;
    if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__s >> 3 == uVar4 + 1) {
      uVar5 = buffer->p_;
    }
    else {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,uVar4 + 1);
      __s = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      pdVar1 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (__s != pdVar1) {
        memset(__s,0,((long)pdVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
      buffer->p_ = 0;
      uVar4 = (ulong)(uint)this->num_filter_order_;
      uVar5 = 0;
    }
    pdVar2 = (this->denominator_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar10 = -input * *pdVar2;
    if (0 < this->num_denominator_order_) {
      lVar7 = 1;
      uVar9 = (ulong)uVar5;
      do {
        iVar8 = (int)uVar9;
        uVar9 = (ulong)(iVar8 - 1);
        if (iVar8 < 1) {
          uVar9 = uVar4 & 0xffffffff;
        }
        dVar10 = dVar10 + __s[(int)uVar9] * pdVar2[lVar7];
        lVar7 = lVar7 + 1;
      } while ((ulong)(uint)this->num_denominator_order_ + 1 != lVar7);
    }
    __s[(int)uVar5] = -dVar10;
    if (this->num_numerator_order_ < 0) {
      dVar10 = 0.0;
    }
    else {
      dVar10 = 0.0;
      lVar7 = 0;
      iVar8 = uVar5 + 1;
      do {
        bVar3 = iVar8 < 1;
        iVar8 = iVar8 + -1;
        if (bVar3) {
          iVar8 = (int)uVar4;
        }
        dVar10 = dVar10 + __s[iVar8] *
                          (this->numerator_coefficients_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7];
        lVar7 = lVar7 + 1;
      } while ((ulong)(uint)this->num_numerator_order_ + 1 != lVar7);
    }
    *output = dVar10;
    iVar8 = 0;
    if ((int)uVar5 < (int)uVar4) {
      iVar8 = uVar5 + 1;
    }
    buffer->p_ = iVar8;
  }
  return bVar6;
}

Assistant:

bool InfiniteImpulseResponseDigitalFilter::Run(
    double input, double* output,
    InfiniteImpulseResponseDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || NULL == output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d_.resize(num_filter_order_ + 1);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
    buffer->p_ = 0;
  }

  double* d(&buffer->d_[0]);

  {
    const double* a(&(denominator_coefficients_[0]));
    double x(-input * a[0]);
    for (int i(1), p(buffer->p_); i <= num_denominator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      x += d[p] * a[i];
    }
    d[buffer->p_] = -x;
  }

  {
    const double* b(&(numerator_coefficients_[0]));
    double y(0.0);
    for (int i(0), p(buffer->p_ + 1); i <= num_numerator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      y += d[p] * b[i];
    }
    *output = y;
  }

  // Update pointer of ring buffer.
  ++(buffer->p_);
  if (num_filter_order_ < buffer->p_) {
    buffer->p_ = 0;
  }

  return true;
}